

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O1

void __thiscall trng::yarn3::split(yarn3 *this,uint s,uint n)

{
  uint i_5;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint i;
  bool bVar16;
  int32_t b [9];
  int32_t a [3];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_40;
  int iStack_3c;
  int local_38;
  
  uVar7 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_68,"invalid argument for trng::yarn3::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_68);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_68);
  }
  if (1 < s) {
    uVar15 = (ulong)n + 1;
    if (n < 0xf) {
      iVar2 = (this->S).r[0];
      iVar14 = (this->S).r[1];
      iVar8 = (this->S).r[2];
      do {
        iVar9 = iVar14;
        iVar14 = iVar2;
        uVar11 = (long)iVar8 * (long)(this->P).a[2] + (long)iVar9 * (long)(this->P).a[1] +
                 (long)iVar14 * (long)(this->P).a[0];
        uVar12 = (uVar11 >> 0x1f) + (uVar11 & 0x7fffffff);
        uVar11 = uVar12 - 0xfffffffe;
        if (uVar12 < 0xfffffffe) {
          uVar11 = uVar12;
        }
        iVar2 = (int)uVar11 + -0x7fffffff;
        if (uVar11 < 0x7fffffff) {
          iVar2 = (int)uVar11;
        }
        uVar13 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar13;
        iVar8 = iVar9;
      } while (uVar13 != 0);
      (this->S).r[0] = iVar2;
      (this->S).r[1] = iVar14;
      (this->S).r[2] = iVar9;
    }
    else {
      uVar13 = 0;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar2 = (this->S).r[0];
    if (s < 0x10) {
      iVar3 = s + (s == 0);
      iVar14 = iVar2;
      iVar8 = (this->S).r[1];
      iVar9 = (this->S).r[2];
      do {
        iVar4 = iVar8;
        iVar8 = iVar14;
        uVar15 = (long)iVar9 * (long)(this->P).a[2] + (long)iVar4 * (long)(this->P).a[1] +
                 (long)iVar8 * (long)(this->P).a[0];
        uVar11 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar11 - 0xfffffffe;
        if (uVar11 < 0xfffffffe) {
          uVar15 = uVar11;
        }
        iVar14 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar14 = (int)uVar15;
        }
        iVar3 = iVar3 + -1;
        iVar9 = iVar4;
      } while (iVar3 != 0);
      (this->S).r[0] = iVar14;
      (this->S).r[1] = iVar8;
      (this->S).r[2] = iVar4;
    }
    else {
      uVar13 = 0;
      uVar15 = uVar7;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar14 = (this->S).r[0];
    if (s < 0x10) {
      iVar4 = s + (s == 0);
      iVar8 = iVar14;
      iVar9 = (this->S).r[1];
      iVar3 = (this->S).r[2];
      do {
        iVar5 = iVar9;
        iVar9 = iVar8;
        uVar15 = (long)iVar3 * (long)(this->P).a[2] + (long)iVar5 * (long)(this->P).a[1] +
                 (long)iVar9 * (long)(this->P).a[0];
        uVar11 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar11 - 0xfffffffe;
        if (uVar11 < 0xfffffffe) {
          uVar15 = uVar11;
        }
        iVar8 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar8 = (int)uVar15;
        }
        iVar4 = iVar4 + -1;
        iVar3 = iVar5;
      } while (iVar4 != 0);
      (this->S).r[0] = iVar8;
      (this->S).r[1] = iVar9;
      (this->S).r[2] = iVar5;
    }
    else {
      uVar13 = 0;
      uVar15 = uVar7;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar8 = (this->S).r[0];
    if (s < 0x10) {
      iVar5 = s + (s == 0);
      iVar9 = iVar8;
      iVar3 = (this->S).r[1];
      iVar4 = (this->S).r[2];
      do {
        iVar6 = iVar3;
        iVar3 = iVar9;
        uVar15 = (long)iVar4 * (long)(this->P).a[2] + (long)iVar6 * (long)(this->P).a[1] +
                 (long)iVar3 * (long)(this->P).a[0];
        uVar11 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar11 - 0xfffffffe;
        if (uVar11 < 0xfffffffe) {
          uVar15 = uVar11;
        }
        iVar9 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar9 = (int)uVar15;
        }
        iVar5 = iVar5 + -1;
        iVar4 = iVar6;
      } while (iVar5 != 0);
      (this->S).r[0] = iVar9;
      (this->S).r[1] = iVar3;
      (this->S).r[2] = iVar6;
    }
    else {
      uVar13 = 0;
      uVar15 = uVar7;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar9 = (this->S).r[0];
    if (s < 0x10) {
      iVar6 = s + (s == 0);
      iVar3 = iVar9;
      iVar4 = (this->S).r[1];
      iVar5 = (this->S).r[2];
      do {
        iVar1 = iVar4;
        iVar4 = iVar3;
        uVar15 = (long)iVar5 * (long)(this->P).a[2] + (long)iVar1 * (long)(this->P).a[1] +
                 (long)iVar4 * (long)(this->P).a[0];
        uVar11 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar11 - 0xfffffffe;
        if (uVar11 < 0xfffffffe) {
          uVar15 = uVar11;
        }
        iVar3 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar3 = (int)uVar15;
        }
        iVar6 = iVar6 + -1;
        iVar5 = iVar1;
      } while (iVar6 != 0);
      (this->S).r[0] = iVar3;
      (this->S).r[1] = iVar4;
      (this->S).r[2] = iVar1;
    }
    else {
      uVar13 = 0;
      uVar15 = uVar7;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar3 = (this->S).r[0];
    if (s < 0x10) {
      iVar1 = s + (s == 0);
      iVar4 = iVar3;
      iVar5 = (this->S).r[1];
      iVar6 = (this->S).r[2];
      do {
        iVar10 = iVar5;
        iVar5 = iVar4;
        uVar7 = (long)iVar6 * (long)(this->P).a[2] + (long)iVar10 * (long)(this->P).a[1] +
                (long)iVar5 * (long)(this->P).a[0];
        uVar15 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
        uVar7 = uVar15 - 0xfffffffe;
        if (uVar15 < 0xfffffffe) {
          uVar7 = uVar15;
        }
        iVar4 = (int)uVar7 + -0x7fffffff;
        if (uVar7 < 0x7fffffff) {
          iVar4 = (int)uVar7;
        }
        iVar1 = iVar1 + -1;
        iVar6 = iVar10;
      } while (iVar1 != 0);
      (this->S).r[0] = iVar4;
      (this->S).r[1] = iVar5;
      (this->S).r[2] = iVar10;
    }
    else {
      uVar13 = 0;
      do {
        if ((uVar7 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar7;
        uVar7 = uVar7 >> 1;
      } while (bVar16);
    }
    local_38 = (this->S).r[0];
    local_68 = iVar8;
    local_64 = iVar14;
    local_60 = iVar2;
    local_5c = iVar9;
    local_58 = iVar8;
    local_54 = iVar14;
    local_50 = iVar3;
    local_4c = iVar9;
    local_48 = iVar8;
    local_40 = iVar9;
    iStack_3c = iVar3;
    int_math::gauss<3>((int32_t (*) [9])&local_68,(int32_t (*) [3])&local_40,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_3c,local_40);
    (this->P).a[2] = local_38;
    (this->S).r[0] = iVar8;
    (this->S).r[1] = iVar14;
    (this->S).r[2] = iVar2;
    iVar2 = 3;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn3::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      int32_t a[3], b[9];
      a[0] = q3;
      b[0] = q2;
      b[1] = q1;
      b[2] = q0;
      a[1] = q4;
      b[3] = q3;
      b[4] = q2;
      b[5] = q1;
      a[2] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      int_math::gauss<3>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      S.r[0] = q2;
      S.r[1] = q1;
      S.r[2] = q0;
      for (int i{0}; i < 3; ++i)
        backward();
    }
  }